

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O1

_Bool sesschan_enable_x11_forwarding
                (Channel *chan,_Bool oneshot,ptrlen authproto,ptrlen authdata_hex,uint screen_number
                )

{
  Channel *plug;
  byte bVar1;
  byte bVar2;
  ptrlen authproto_00;
  ptrlen authdata;
  strbuf *buf_o;
  Channel *pCVar3;
  uint uVar4;
  ushort **ppuVar5;
  ulong uVar6;
  char *screen_number_suffix;
  ulong uVar7;
  BinarySink *bs;
  _Bool _Var8;
  char hexbuf [3];
  byte local_63;
  byte local_62;
  undefined1 local_61;
  strbuf *local_60;
  void *local_58;
  size_t local_50;
  Channel *local_48;
  uchar *local_40;
  size_t sStack_38;
  
  local_50 = authproto.len;
  local_58 = authproto.ptr;
  if ((((byte)authdata_hex.len | oneshot) & 1) == 0) {
    local_48 = chan;
    local_60 = strbuf_new_nm();
    if (authdata_hex.len != 0) {
      ppuVar5 = __ctype_b_loc();
      bs = local_60->binarysink_;
      uVar7 = 0;
      do {
        bVar1 = *(byte *)((long)authdata_hex.ptr + uVar7);
        if (((*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 0x10) == 0) ||
           (bVar2 = *(byte *)((long)authdata_hex.ptr + uVar7 + 1),
           (*(byte *)((long)*ppuVar5 + (ulong)bVar2 * 2 + 1) & 0x10) == 0)) {
          strbuf_free(local_60);
          goto LAB_00116544;
        }
        local_61 = 0;
        local_63 = bVar1;
        local_62 = bVar2;
        uVar6 = strtoul((char *)&local_63,(char **)0x0,0x10);
        BinarySink_put_byte(bs,(uchar)uVar6);
        uVar7 = uVar7 + 2;
      } while (uVar7 < authdata_hex.len);
    }
    pCVar3 = local_48;
    plug = local_48 + -7;
    local_48[-7].vt = (ChannelVtable *)&xfwd_plugvt;
    screen_number_suffix = dupprintf(".%u",(ulong)screen_number);
    buf_o = local_60;
    local_40 = local_60->u;
    sStack_38 = local_60->len;
    authdata.ptr = local_60->u;
    authdata.len = local_60->len;
    authproto_00.len = local_50;
    authproto_00.ptr = local_58;
    uVar4 = platform_make_x11_server
                      ((Plug *)plug,"Uppity",10,screen_number_suffix,authproto_00,authdata,
                       (Socket **)(pCVar3 + -6),(Conf *)pCVar3[-0x5c].vt);
    pCVar3[-7].initial_fixed_window_size = uVar4;
    safefree(screen_number_suffix);
    strbuf_free(buf_o);
    _Var8 = pCVar3[-7].initial_fixed_window_size != 0;
  }
  else {
LAB_00116544:
    _Var8 = false;
  }
  return _Var8;
}

Assistant:

bool sesschan_enable_x11_forwarding(
    Channel *chan, bool oneshot, ptrlen authproto, ptrlen authdata_hex,
    unsigned screen_number)
{
    sesschan *sess = container_of(chan, sesschan, chan);
    strbuf *authdata_bin;
    size_t i;

    if (oneshot)
        return false;                  /* not supported */

    /*
     * Decode the authorisation data from ASCII hex into binary.
     */
    if (authdata_hex.len % 2)
        return false;                  /* expected an even number of digits */
    authdata_bin = strbuf_new_nm();
    for (i = 0; i < authdata_hex.len; i += 2) {
        const unsigned char *hex = authdata_hex.ptr;
        char hexbuf[3];

        if (!isxdigit(hex[i]) || !isxdigit(hex[i+1])) {
            strbuf_free(authdata_bin);
            return false;              /* not hex */
        }

        hexbuf[0] = hex[i];
        hexbuf[1] = hex[i+1];
        hexbuf[2] = '\0';
        put_byte(authdata_bin, strtoul(hexbuf, NULL, 16));
    }

    sess->xfwd_plug.vt = &xfwd_plugvt;

    char *screensuffix = dupprintf(".%u", screen_number);

    sess->n_x11_sockets = platform_make_x11_server(
        &sess->xfwd_plug, appname, 10, screensuffix,
        authproto, ptrlen_from_strbuf(authdata_bin),
        sess->x11_sockets, sess->conf);

    sfree(screensuffix);
    strbuf_free(authdata_bin);
    return sess->n_x11_sockets != 0;
}